

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void dump_autoinscriptions(ang_file *f)

{
  char *pcVar1;
  char *pcVar2;
  char *note;
  char name [120];
  object_kind *k;
  wchar_t i;
  ang_file *f_local;
  
  for (k._4_4_ = 0; k._4_4_ < (int)(uint)z_info->k_max; k._4_4_ = k._4_4_ + 1) {
    name._112_8_ = k_info + k._4_4_;
    if (((((object_kind *)name._112_8_)->name != (char *)0x0) &&
        (((object_kind *)name._112_8_)->tval != 0)) &&
       (pcVar1 = get_autoinscription((object_kind *)name._112_8_,true), pcVar1 != (char *)0x0)) {
      object_short_name((char *)&note,0x78,*(char **)name._112_8_);
      pcVar2 = tval_find_name(*(wchar_t *)(name._112_8_ + 0x24));
      file_putf(f,"inscribe:%s:%s:%s\n",pcVar2,&note,pcVar1);
    }
  }
  return;
}

Assistant:

void dump_autoinscriptions(ang_file *f) {
	int i;
	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *k = &k_info[i];
		char name[120];
		const char *note;

		if (!k->name || !k->tval) continue;

		/* Only aware autoinscriptions go to the prefs file */
		note = get_autoinscription(k, true);
		if (note) {
			object_short_name(name, sizeof name, k->name);
			file_putf(f, "inscribe:%s:%s:%s\n", tval_find_name(k->tval), name, note);
		}
	}
}